

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O2

bool check_in_8_handles(Am_Object *sel_handles,int x,int y)

{
  int iVar1;
  int iVar2;
  Am_Value *pAVar3;
  
  pAVar3 = Am_Object::Get(sel_handles,0x66,0);
  iVar1 = Am_Value::operator_cast_to_int(pAVar3);
  pAVar3 = Am_Object::Get(sel_handles,0x67,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar3);
  if (0xd < x) {
    if (x <= iVar1 / 2 + 7 && iVar1 / 2 + -7 <= x) {
      if (y <= iVar2 + -0xd && 0xd < y) {
        return false;
      }
      return true;
    }
    if (x <= iVar1 + -0xd) {
      return false;
    }
  }
  if (y < 0xe) {
    return true;
  }
  if (y <= iVar2 + -0xd && (iVar2 / 2 + 7 < y || y < iVar2 / 2 + -7)) {
    return false;
  }
  return true;
}

Assistant:

bool
check_in_8_handles(Am_Object sel_handles, int x, int y)
{
  int width = sel_handles.Get(Am_WIDTH);
  int height = sel_handles.Get(Am_HEIGHT);

  int width_d2 = width / 2;
  int height_d2 = height / 2;

  if (x <= HANDLE_SIZE) {
    // left-top
    if (y <= HANDLE_SIZE)
      return true;
    // left-middle
    if (y >= height_d2 - HANDLE_SIZE_D2 && y <= height_d2 + HANDLE_SIZE_D2)
      return true;
    // left-bottom
    if (y > height - HANDLE_SIZE)
      return true;
  } else if (x >= width_d2 - HANDLE_SIZE_D2 && x <= width_d2 + HANDLE_SIZE_D2) {
    // middle-top
    if (y <= HANDLE_SIZE)
      return true;
    // middle-bottom
    if (y > height - HANDLE_SIZE)
      return true;
  } else if (x > width - HANDLE_SIZE) {
    // right-top
    if (y <= HANDLE_SIZE)
      return true;
    // right-middle
    if (y >= height_d2 - HANDLE_SIZE_D2 && y <= height_d2 + HANDLE_SIZE_D2)
      return true;
    // right-bottom
    if (y > height - HANDLE_SIZE)
      return true;
  }
  //if get here, then not over a handle
  return false;
}